

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O2

void __thiscall czh::lexer::Lexer::reset(Lexer *this)

{
  Pos PStack_88;
  Token local_68;
  
  this->is_eof = false;
  token::Pos::Pos(&PStack_88,&this->codepos);
  token::Token::Token<int>(&local_68,UNEXPECTED,0,&PStack_88);
  token::Token::operator=(&this->buffer,&local_68);
  token::Token::~Token(&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&PStack_88.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  (this->match).state = INIT;
  (this->match).last_state = UNEXPECTED;
  (this->nmatch).state = INIT;
  (this->nmatch)._is_double = false;
  (this->codepos).pos = 0;
  (this->codepos).size = 0;
  return;
}

Assistant:

void reset()
    {
      is_eof = false;
      buffer = token::Token{token::TokenType::UNEXPECTED, 0, codepos};
      match.reset();
      nmatch.reset();
      codepos.reset();
    }